

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::add_failed_bytes(torrent *this,int b)

{
  long value;
  long lVar1;
  
  value = (long)b;
  lVar1 = this->m_total_failed_bytes + value;
  if (0x7fffffffffffffff - value < this->m_total_failed_bytes) {
    lVar1 = 0x7fffffffffffffff;
  }
  this->m_total_failed_bytes = lVar1;
  counters::inc_stats_counter(this->m_stats_counters,0x87,value);
  return;
}

Assistant:

void torrent::add_failed_bytes(int const b)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(b > 0);
		if (m_total_failed_bytes <= std::numeric_limits<std::int64_t>::max() - b)
			m_total_failed_bytes += b;
		else
			m_total_failed_bytes = std::numeric_limits<std::int64_t>::max();

		// the stats counters are 64 bits, so we don't check for overflow there
		m_stats_counters.inc_stats_counter(counters::recv_failed_bytes, b);
	}